

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampParameterBorderColorError.cpp
# Opt level: O2

void __thiscall
glcts::TextureBorderClampParameterBorderColorErrorTest::deinit
          (TextureBorderClampParameterBorderColorErrorTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TextureBorderClampBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xa8))(0,0);
  if (this->m_sampler_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x468))(1,&this->m_sampler_id);
    this->m_sampler_id = 0;
  }
  TextureBorderClampBase::deinit(&this->super_TextureBorderClampBase);
  return;
}

Assistant:

void TextureBorderClampParameterBorderColorErrorTest::deinit(void)
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release sampler object */
	gl.bindSampler(m_texture_unit, 0);

	if (0 != m_sampler_id)
	{
		gl.deleteSamplers(1, &m_sampler_id);

		m_sampler_id = 0;
	}

	/* Deinitializes base class */
	TextureBorderClampBase::deinit();
}